

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O0

void __thiscall SuffixTest_VisitSuffixValues_Test::TestBody(SuffixTest_VisitSuffixValues_Test *this)

{
  StringRef name;
  StringRef name_00;
  char *pcVar1;
  MockSpec<void_(int,_int)> *table;
  MockSpec<void_(int,_int)> *this_00;
  MockValueVisitor *v_00;
  SuffixBase SVar2;
  MockValueVisitor *this_01;
  char *in_RDI;
  MockValueVisitor v_1;
  BasicMutSuffix<double> ds;
  MockValueVisitor v;
  BasicMutSuffix<int> is;
  Suffix s;
  Suffix *in_stack_fffffffffffffc18;
  SuffixBase in_stack_fffffffffffffc20;
  Matcher<int> *in_stack_fffffffffffffc28;
  Matcher<int> *gmock_a1;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  MockValueVisitor *in_stack_fffffffffffffc38;
  BasicMutSuffix<int> *in_stack_fffffffffffffc40;
  string *this_02;
  undefined8 in_stack_fffffffffffffc48;
  int iVar3;
  Matcher<int> *in_stack_fffffffffffffc50;
  SuffixTable *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  Matcher<double> *this_03;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 uVar4;
  char *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd24;
  char *in_stack_fffffffffffffd28;
  MockSpec<void_(int,_int)> *in_stack_fffffffffffffd30;
  string local_200 [48];
  Matcher<int> local_1d0 [15];
  Impl *local_68;
  MatcherInterface<double> *local_60;
  string local_48 [48];
  Matcher<double> local_18;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  mp::Suffix::Suffix((Suffix *)0x116809);
  pcVar1 = in_RDI + 0x10;
  fmt::BasicStringRef<char>::BasicStringRef
            (&(in_stack_fffffffffffffc20.impl_)->name,(char *)in_stack_fffffffffffffc18);
  std::__cxx11::string::string(local_48);
  name.size_ = (size_t)pcVar1;
  name.data_ = in_RDI;
  local_18.super_MatcherBase<double>._vptr_MatcherBase =
       (_func_int **)
       mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
                 ((BasicSuffixSet<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),name,
                  (int)((ulong)in_stack_fffffffffffffc60 >> 0x20),(int)in_stack_fffffffffffffc60,
                  in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_48);
  this_03 = &local_18;
  uVar4 = 0;
  mp::BasicMutSuffix<int>::set_value
            (in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (int)in_stack_fffffffffffffc38);
  mp::BasicMutSuffix<int>::set_value
            (in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (int)in_stack_fffffffffffffc38);
  mp::BasicMutSuffix<int>::set_value
            (in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
             (int)in_stack_fffffffffffffc38);
  local_68 = (Impl *)local_18.super_MatcherBase<double>._vptr_MatcherBase;
  mp::Suffix::Suffix<int>
            (in_stack_fffffffffffffc18,(BasicSuffix<int>)in_stack_fffffffffffffc20.impl_);
  local_18.super_MatcherBase<double>.impl_.value_ = local_60;
  MockValueVisitor::MockValueVisitor
            ((MockValueVisitor *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffc50,iVar3);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffc50,iVar3);
  table = MockValueVisitor::gmock_Visit
                    ((MockValueVisitor *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28,(Matcher<int> *)in_stack_fffffffffffffc20.impl_);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd24,
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116989);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116996);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffc50,iVar3);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffffc50,iVar3);
  this_00 = MockValueVisitor::gmock_Visit
                      ((MockValueVisitor *)
                       CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       in_stack_fffffffffffffc28,(Matcher<int> *)in_stack_fffffffffffffc20.impl_);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd24,
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116a15);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116a22);
  mp::Suffix::VisitValues<MockValueVisitor>
            ((Suffix *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  MockValueVisitor::~MockValueVisitor((MockValueVisitor *)in_stack_fffffffffffffc20.impl_);
  v_00 = (MockValueVisitor *)(in_RDI + 0x10);
  fmt::BasicStringRef<char>::BasicStringRef
            (&(in_stack_fffffffffffffc20.impl_)->name,(char *)in_stack_fffffffffffffc18);
  this_02 = local_200;
  std::__cxx11::string::string(this_02);
  name_00.size_ = (size_t)pcVar1;
  name_00.data_ = in_RDI;
  SVar2.impl_ = (Impl *)mp::BasicSuffixSet<std::allocator<char>_>::Add<double>
                                  ((BasicSuffixSet<std::allocator<char>_> *)
                                   CONCAT44(uVar4,in_stack_fffffffffffffc68),name_00,
                                   (int)((ulong)this_03 >> 0x20),(int)this_03,(SuffixTable *)table);
  local_1d0[0].super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)SVar2.impl_;
  std::__cxx11::string::~string(local_200);
  gmock_a1 = local_1d0;
  uVar4 = 0;
  iVar3 = SUB84(SVar2.impl_,4);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)this_00,iVar3,(double)this_02);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)this_00,iVar3,(double)this_02);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)this_00,iVar3,(double)this_02);
  mp::Suffix::Suffix<double>
            (in_stack_fffffffffffffc18,(BasicSuffix<double>)in_stack_fffffffffffffc20.impl_);
  MockValueVisitor::MockValueVisitor((MockValueVisitor *)CONCAT44(uVar4,in_stack_fffffffffffffc30));
  testing::Matcher<int>::Matcher((Matcher<int> *)this_00,iVar3);
  testing::Matcher<double>::Matcher(this_03,(double)table);
  this_01 = (MockValueVisitor *)
            MockValueVisitor::gmock_Visit
                      ((MockValueVisitor *)CONCAT44(uVar4,in_stack_fffffffffffffc30),gmock_a1,
                       (Matcher<double> *)in_stack_fffffffffffffc20.impl_);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            ((MockSpec<void_(int,_double)> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x116bce);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116bdb);
  testing::Matcher<int>::Matcher((Matcher<int> *)this_00,iVar3);
  testing::Matcher<double>::Matcher(this_03,(double)table);
  MockValueVisitor::gmock_Visit
            ((MockValueVisitor *)CONCAT44(uVar4,in_stack_fffffffffffffc30),gmock_a1,
             (Matcher<double> *)this_01);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            ((MockSpec<void_(int,_double)> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x116c52);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x116c5f);
  mp::Suffix::VisitValues<MockValueVisitor>((Suffix *)this_02,v_00);
  MockValueVisitor::~MockValueVisitor(this_01);
  return;
}

Assistant:

TEST_F(SuffixTest, VisitSuffixValues) {
  Suffix s;
  {
    auto is = suffixes_.Add<int>("is", 0, 3);
    is.set_value(0, 42);
    is.set_value(1, 0);
    is.set_value(2, 11);
    s = is;
  }
  {
    MockValueVisitor v;
    EXPECT_CALL(v, Visit(0, Matcher<int>(42)));
    EXPECT_CALL(v, Visit(2, Matcher<int>(11)));
    s.VisitValues(v);
  }
  {
    auto ds = suffixes_.Add<double>("ds", 0, 3);
    ds.set_value(0, 4.2);
    ds.set_value(1, 0);
    ds.set_value(2, 1.1);
    s = ds;
  }
  {
    MockValueVisitor v;
    EXPECT_CALL(v, Visit(0, Matcher<double>(4.2)));
    EXPECT_CALL(v, Visit(2, Matcher<double>(1.1)));
    s.VisitValues(v);
  }
}